

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::ConfidentialTransaction::GetByteData
          (ByteData *__return_storage_ptr__,ConfidentialTransaction *this,bool has_witness)

{
  wally_tx_output *pwVar1;
  wally_tx_witness_stack *pwVar2;
  uchar *puVar3;
  wally_tx_witness_item *pwVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint32_t *puVar9;
  uint32_t *puVar10;
  ulong uVar11;
  CfdException *pCVar12;
  uint uVar13;
  undefined7 in_register_00000011;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  uint uVar17;
  size_t max_size;
  ulong uVar18;
  uint32_t flags;
  size_t *psVar19;
  uint8_t *result;
  uint8_t *puVar20;
  uint64_t uVar21;
  uint8_t *buffer_addr;
  long lVar22;
  wally_tx *pwVar23;
  byte bVar24;
  wally_tx_input *pwVar25;
  size_t *psVar26;
  int ret;
  size_t size;
  size_t txsize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ulong local_a8;
  int local_a0;
  bool local_99;
  pointer local_98;
  wally_tx *local_90;
  size_t *local_88;
  undefined1 local_80 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  uint local_44;
  ulong local_40;
  ByteData *local_38;
  
  local_90 = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  local_98 = (pointer)0x0;
  flags = (uint32_t)CONCAT71(in_register_00000011,has_witness);
  local_99 = has_witness;
  local_a0 = wally_tx_get_length(local_90,flags,(size_t *)&local_98);
  if (local_a0 != 0) {
    local_80._0_8_ = "cfdcore_elements_transaction.cpp";
    local_80._8_4_ = 0xe7b;
    local_80._16_8_ = "GetByteData";
    logger::log<int&,bool&>
              ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,
               "wally_tx_get_length NG[{}]. wit[{}]",&local_a0,&local_99);
    pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"tx length calc error.","")
    ;
    CfdException::CfdException(pCVar12,kCfdIllegalStateError,(string *)local_80);
    __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_a0 = 0;
  if (local_98 < &DAT_0000000b) {
    local_a0 = -2;
    local_80._0_8_ = "cfdcore_elements_transaction.cpp";
    local_80._8_4_ = 0xe82;
    local_80._16_8_ = "GetByteData";
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"tx size low.[{}]",
               (unsigned_long *)&local_98);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,(size_type)local_98,
             (allocator_type *)local_80);
  if (local_a0 != -2) {
    local_80._0_8_ = local_98;
    local_a0 = wally_tx_to_bytes(local_90,flags,
                                 local_60.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                                 (long)local_60.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_60.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start,(size_t *)local_80)
    ;
  }
  pwVar23 = local_90;
  if (local_a0 != 0) {
    if (local_a0 != -2) {
      local_80._0_8_ = "cfdcore_elements_transaction.cpp";
      local_80._8_4_ = 0xf6c;
      local_80._16_8_ = "GetByteData";
      logger::log<int&>((CfdSourceLocation *)local_80,kCfdLogLevelWarning,
                        "wally_tx_to_bytes NG[{}].",&local_a0);
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      local_80._0_8_ = local_80 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,"tx hex convert error.","");
      CfdException::CfdException(pCVar12,kCfdIllegalStateError,(string *)local_80);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
    psVar26 = &local_90->num_inputs;
    if ((local_90->num_inputs != 0) && (local_90->num_outputs != 0)) {
      local_80._0_8_ = "cfdcore_elements_transaction.cpp";
      local_80._8_4_ = 0xf67;
      local_80._16_8_ = "GetByteData";
      logger::log<int&,unsigned_long&,unsigned_long&>
                ((CfdSourceLocation *)local_80,kCfdLogLevelWarning,
                 "wally_tx_to_bytes NG[{}]. in/out={}/{}",&local_a0,psVar26,&local_90->num_outputs);
      pCVar12 = (CfdException *)__cxa_allocate_exception(0x30);
      local_80._0_8_ = local_80 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,"tx hex convert error.","");
      CfdException::CfdException(pCVar12,kCfdIllegalStateError,(string *)local_80);
      __cxa_throw(pCVar12,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_80._0_8_ = "cfdcore_elements_transaction.cpp";
    local_80._8_4_ = 0xe92;
    local_80._16_8_ = "GetByteData";
    logger::log<unsigned_long&>
              ((CfdSourceLocation *)local_80,kCfdLogLevelInfo,"wally_tx_get_length size[{}]",
               (unsigned_long *)&local_98);
    local_a8 = pwVar23->num_inputs * 0xd0 + pwVar23->num_outputs * 0x70 + 0x38;
    if (pwVar23->num_inputs != 0) {
      pwVar25 = pwVar23->inputs;
      uVar13 = 1;
      uVar11 = 0;
      do {
        uVar14 = local_a8 + 0x40;
        if (pwVar25[uVar11].issuance_amount != (uchar *)0x0) {
          uVar14 = pwVar25[uVar11].issuance_amount_len + local_a8 + 0x4a;
        }
        local_a8 = uVar14;
        if (pwVar25[uVar11].inflation_keys != (uchar *)0x0) {
          local_a8 = uVar14 + pwVar25[uVar11].inflation_keys_len + 10;
        }
        uVar11 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar11 < *psVar26);
    }
    if (pwVar23->num_outputs != 0) {
      pwVar1 = pwVar23->outputs;
      uVar11 = 1;
      uVar14 = 0;
      do {
        uVar15 = uVar11;
        if (pwVar1[uVar14].asset != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].asset_len + 10;
        }
        if (pwVar1[uVar14].value != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].value_len + 10;
        }
        if (pwVar1[uVar14].nonce != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].nonce_len + 10;
        }
        if (pwVar1[uVar14].script != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].script_len + 10;
        }
        local_a8 = local_a8 + 10;
        uVar11 = (ulong)((int)uVar15 + 1);
        uVar14 = uVar15;
      } while (uVar15 < pwVar23->num_outputs);
    }
    uVar11 = 0;
    if (*psVar26 == 0) {
      bVar16 = 0;
    }
    else {
      pwVar25 = pwVar23->inputs;
      bVar16 = 0;
      uVar14 = 0;
      do {
        if (pwVar25[uVar11].issuance_amount_rangeproof != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar25[uVar11].issuance_amount_rangeproof_len + 10;
          uVar14 = CONCAT71((int7)(pwVar25[uVar11].issuance_amount_rangeproof_len >> 8),1);
        }
        if (pwVar25[uVar11].inflation_keys_rangeproof != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar25[uVar11].inflation_keys_rangeproof_len + 10;
          uVar14 = CONCAT71((int7)(pwVar25[uVar11].inflation_keys_rangeproof_len >> 8),1);
        }
        pwVar2 = pwVar25[uVar11].witness;
        if (pwVar2 == (wally_tx_witness_stack *)0x0) {
          uVar15 = 0;
        }
        else {
          uVar15 = pwVar2->num_items;
        }
        if (uVar15 != 0) {
          psVar19 = &pwVar2->items->witness_len;
          uVar13 = 1;
          do {
            local_a8 = local_a8 + *psVar19 + 10;
            uVar18 = (ulong)uVar13;
            psVar19 = psVar19 + 2;
            uVar13 = uVar13 + 1;
          } while (uVar18 < uVar15);
          bVar16 = 1;
        }
        pwVar2 = pwVar25[uVar11].pegin_witness;
        if (pwVar2 == (wally_tx_witness_stack *)0x0) {
          uVar15 = 0;
        }
        else {
          uVar15 = pwVar2->num_items;
        }
        if (uVar15 != 0) {
          psVar19 = &pwVar2->items->witness_len;
          uVar13 = 1;
          do {
            local_a8 = local_a8 + *psVar19 + 10;
            uVar18 = (ulong)uVar13;
            psVar19 = psVar19 + 2;
            uVar13 = uVar13 + 1;
          } while (uVar18 < uVar15);
          bVar16 = 1;
        }
        local_a8 = local_a8 + 10;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (uVar11 < *psVar26);
      bVar16 = bVar16 | (byte)uVar14;
      uVar11 = uVar14 & 0xffffffff;
    }
    if (pwVar23->num_outputs == 0) {
      bVar24 = 0;
    }
    else {
      pwVar1 = pwVar23->outputs;
      uVar13 = 1;
      uVar14 = 0;
      bVar24 = 0;
      do {
        if (pwVar1[uVar14].surjectionproof != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].surjectionproof_len + 10;
          bVar24 = 1;
        }
        if (pwVar1[uVar14].rangeproof != (uchar *)0x0) {
          local_a8 = local_a8 + pwVar1[uVar14].rangeproof_len + 10;
          bVar24 = 1;
        }
        local_a8 = local_a8 + 10;
        uVar14 = (ulong)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar14 < pwVar23->num_outputs);
    }
    local_38 = __return_storage_ptr__;
    if ((ulong)((long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < local_a8) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,local_a8);
      local_80._0_8_ = "cfdcore_elements_transaction.cpp";
      local_80._8_4_ = 0xedb;
      local_80._16_8_ = "GetByteData";
      logger::log<unsigned_long&>
                ((CfdSourceLocation *)local_80,kCfdLogLevelInfo,"buffer.resize[{}]",&local_a8);
    }
    *(uint32_t *)
     local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_start = pwVar23->version;
    uVar13 = 1;
    if (bVar16 == 0) {
      uVar13 = (uint)bVar24;
    }
    uVar17 = 0;
    if ((pwVar23->version >> 0x1e & 1) == 0) {
      uVar17 = uVar13;
    }
    *(char *)((long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 4) = (char)uVar17;
    puVar9 = (uint32_t *)
             AbstractTransaction::CopyVariableInt
                       (pwVar23->num_inputs,
                        (uint8_t *)
                        ((long)local_60.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + 5));
    local_88 = psVar26;
    local_44 = uVar17;
    if (*psVar26 != 0) {
      uVar14 = 0;
      uVar15 = 1;
      local_40 = uVar11;
      do {
        pwVar25 = pwVar23->inputs;
        uVar13 = pwVar25[uVar14].index;
        if ((pwVar25[uVar14].pegin_witness != (wally_tx_witness_stack *)0x0) &&
           ((pwVar25[uVar14].pegin_witness)->num_items != 0)) {
          uVar13 = uVar13 | 0x40000000;
        }
        pwVar25 = pwVar25 + uVar14;
        if ((pwVar25->issuance_amount != (uchar *)0x0) && (pwVar25->issuance_amount_len != 0)) {
          uVar13 = uVar13 | 0x80000000;
        }
        uVar6 = *(undefined8 *)pwVar25->txhash;
        uVar7 = *(undefined8 *)(pwVar25->txhash + 8);
        uVar8 = *(undefined8 *)(pwVar25->txhash + 0x18);
        *(undefined8 *)(puVar9 + 4) = *(undefined8 *)(pwVar25->txhash + 0x10);
        *(undefined8 *)(puVar9 + 6) = uVar8;
        *(undefined8 *)puVar9 = uVar6;
        *(undefined8 *)(puVar9 + 2) = uVar7;
        puVar9[8] = uVar13;
        puVar10 = (uint32_t *)
                  AbstractTransaction::CopyVariableBuffer
                            (pwVar25->script,pwVar25->script_len,(uint8_t *)(puVar9 + 9));
        *puVar10 = pwVar25->sequence;
        puVar9 = puVar10 + 1;
        psVar26 = local_88;
        if ((uVar11 & 1) != 0) {
          uVar6 = *(undefined8 *)pwVar25->blinding_nonce;
          uVar7 = *(undefined8 *)(pwVar25->blinding_nonce + 8);
          uVar8 = *(undefined8 *)(pwVar25->blinding_nonce + 0x18);
          *(undefined8 *)(puVar10 + 5) = *(undefined8 *)(pwVar25->blinding_nonce + 0x10);
          *(undefined8 *)(puVar10 + 7) = uVar8;
          *(undefined8 *)puVar9 = uVar6;
          *(undefined8 *)(puVar10 + 3) = uVar7;
          uVar6 = *(undefined8 *)pwVar25->entropy;
          uVar7 = *(undefined8 *)(pwVar25->entropy + 8);
          uVar8 = *(undefined8 *)(pwVar25->entropy + 0x18);
          *(undefined8 *)(puVar10 + 0xd) = *(undefined8 *)(pwVar25->entropy + 0x10);
          *(undefined8 *)(puVar10 + 0xf) = uVar8;
          *(undefined8 *)(puVar10 + 9) = uVar6;
          *(undefined8 *)(puVar10 + 0xb) = uVar7;
          puVar3 = pwVar25->issuance_amount;
          uVar11 = pwVar25->issuance_amount_len;
          if (uVar11 == 0 || puVar3 == (uchar *)0x0) {
LAB_003b534b:
            *(uint8_t *)(puVar10 + 0x11) = '\0';
            puVar20 = (uint8_t *)((long)puVar10 + 0x45);
          }
          else {
            if (*puVar3 == '\x01') {
              uVar14 = 9;
            }
            else {
              uVar14 = 0x21;
              if (*puVar3 == '\0') goto LAB_003b534b;
            }
            puVar10 = puVar10 + 0x11;
            memset(puVar10,0,uVar14);
            if (uVar14 < uVar11) {
              uVar11 = uVar14;
            }
            memcpy(puVar10,puVar3,uVar11);
            puVar20 = (uint8_t *)((long)puVar10 + uVar14);
          }
          psVar26 = local_88;
          puVar3 = pwVar25->inflation_keys;
          uVar11 = pwVar25->inflation_keys_len;
          if (uVar11 == 0 || puVar3 == (uchar *)0x0) {
LAB_003b53c5:
            *puVar20 = '\0';
            puVar9 = (uint32_t *)(puVar20 + 1);
            uVar11 = local_40;
            pwVar23 = local_90;
          }
          else {
            if (*puVar3 == '\x01') {
              uVar14 = 9;
            }
            else {
              uVar14 = 0x21;
              if (*puVar3 == '\0') goto LAB_003b53c5;
            }
            memset(puVar20,0,uVar14);
            if (uVar14 < uVar11) {
              uVar11 = uVar14;
            }
            memcpy(puVar20,puVar3,uVar11);
            puVar9 = (uint32_t *)(puVar20 + uVar14);
            uVar11 = local_40;
            pwVar23 = local_90;
          }
        }
        bVar5 = uVar15 < *psVar26;
        uVar14 = uVar15;
        uVar15 = (ulong)((int)uVar15 + 1);
      } while (bVar5);
    }
    puVar9 = (uint32_t *)
             AbstractTransaction::CopyVariableInt(pwVar23->num_outputs,(uint8_t *)puVar9);
    if (pwVar23->num_outputs != 0) {
      uVar11 = 0;
      uVar14 = 1;
      do {
        pwVar1 = pwVar23->outputs;
        puVar3 = pwVar1[uVar11].asset;
        uVar15 = pwVar1[uVar11].asset_len;
        if ((uVar15 == 0 || puVar3 == (uchar *)0x0) || (*puVar3 == '\0')) {
          *(uint8_t *)puVar9 = '\0';
          lVar22 = 1;
        }
        else {
          puVar9[4] = 0;
          puVar9[5] = 0;
          puVar9[6] = 0;
          puVar9[7] = 0;
          puVar9[0] = 0;
          puVar9[1] = 0;
          puVar9[2] = 0;
          puVar9[3] = 0;
          *(uint8_t *)(puVar9 + 8) = '\0';
          lVar22 = 0x21;
          if (0x20 < uVar15) {
            uVar15 = 0x21;
          }
          memcpy(puVar9,puVar3,uVar15);
        }
        puVar20 = (uint8_t *)((long)puVar9 + lVar22);
        puVar3 = pwVar1[uVar11].value;
        uVar15 = pwVar1[uVar11].value_len;
        if (uVar15 == 0 || puVar3 == (uchar *)0x0) {
LAB_003b54c6:
          *puVar20 = '\0';
          uVar18 = 1;
        }
        else {
          if (*puVar3 == '\x01') {
            uVar18 = 9;
          }
          else {
            uVar18 = 0x21;
            if (*puVar3 == '\0') goto LAB_003b54c6;
          }
          memset(puVar20,0,uVar18);
          if (uVar18 < uVar15) {
            uVar15 = uVar18;
          }
          memcpy(puVar20,puVar3,uVar15);
        }
        pwVar23 = local_90;
        puVar20 = puVar20 + uVar18;
        puVar3 = pwVar1[uVar11].nonce;
        uVar15 = pwVar1[uVar11].nonce_len;
        if ((uVar15 == 0 || puVar3 == (uchar *)0x0) || (*puVar3 == '\0')) {
          *puVar20 = '\0';
          lVar22 = 1;
        }
        else {
          puVar20[0x10] = '\0';
          puVar20[0x11] = '\0';
          puVar20[0x12] = '\0';
          puVar20[0x13] = '\0';
          puVar20[0x14] = '\0';
          puVar20[0x15] = '\0';
          puVar20[0x16] = '\0';
          puVar20[0x17] = '\0';
          puVar20[0x18] = '\0';
          puVar20[0x19] = '\0';
          puVar20[0x1a] = '\0';
          puVar20[0x1b] = '\0';
          puVar20[0x1c] = '\0';
          puVar20[0x1d] = '\0';
          puVar20[0x1e] = '\0';
          puVar20[0x1f] = '\0';
          puVar20[0] = '\0';
          puVar20[1] = '\0';
          puVar20[2] = '\0';
          puVar20[3] = '\0';
          puVar20[4] = '\0';
          puVar20[5] = '\0';
          puVar20[6] = '\0';
          puVar20[7] = '\0';
          puVar20[8] = '\0';
          puVar20[9] = '\0';
          puVar20[10] = '\0';
          puVar20[0xb] = '\0';
          puVar20[0xc] = '\0';
          puVar20[0xd] = '\0';
          puVar20[0xe] = '\0';
          puVar20[0xf] = '\0';
          puVar20[0x20] = '\0';
          lVar22 = 0x21;
          if (0x20 < uVar15) {
            uVar15 = 0x21;
          }
          memcpy(puVar20,puVar3,uVar15);
        }
        puVar9 = (uint32_t *)
                 AbstractTransaction::CopyVariableBuffer
                           (pwVar1[uVar11].script,pwVar1[uVar11].script_len,puVar20 + lVar22);
        bVar5 = uVar14 < pwVar23->num_outputs;
        uVar11 = uVar14;
        uVar14 = (ulong)((int)uVar14 + 1);
      } while (bVar5);
    }
    *puVar9 = pwVar23->locktime;
    puVar9 = puVar9 + 1;
    if ((char)local_44 != '\0') {
      if (*local_88 != 0) {
        uVar11 = 0;
        do {
          pwVar25 = pwVar23->inputs;
          puVar20 = AbstractTransaction::CopyVariableBuffer
                              (pwVar25[uVar11].issuance_amount_rangeproof,
                               pwVar25[uVar11].issuance_amount_rangeproof_len,(uint8_t *)puVar9);
          puVar20 = AbstractTransaction::CopyVariableBuffer
                              (pwVar25[uVar11].inflation_keys_rangeproof,
                               pwVar25[uVar11].inflation_keys_rangeproof_len,puVar20);
          psVar26 = local_88;
          if (pwVar25[uVar11].witness == (wally_tx_witness_stack *)0x0) {
            uVar21 = 0;
          }
          else {
            uVar21 = (pwVar25[uVar11].witness)->num_items;
          }
          puVar20 = AbstractTransaction::CopyVariableInt(uVar21,puVar20);
          if (uVar21 != 0) {
            uVar14 = 0;
            uVar15 = 1;
            do {
              pwVar4 = (pwVar25[uVar11].witness)->items;
              puVar20 = AbstractTransaction::CopyVariableBuffer
                                  (pwVar4[uVar14].witness,pwVar4[uVar14].witness_len,puVar20);
              bVar5 = uVar15 < uVar21;
              uVar14 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar5);
          }
          if (pwVar25[uVar11].pegin_witness == (wally_tx_witness_stack *)0x0) {
            uVar21 = 0;
          }
          else {
            uVar21 = (pwVar25[uVar11].pegin_witness)->num_items;
          }
          puVar9 = (uint32_t *)AbstractTransaction::CopyVariableInt(uVar21,puVar20);
          if (uVar21 != 0) {
            uVar14 = 0;
            uVar15 = 1;
            do {
              pwVar4 = (pwVar25[uVar11].pegin_witness)->items;
              puVar9 = (uint32_t *)
                       AbstractTransaction::CopyVariableBuffer
                                 (pwVar4[uVar14].witness,pwVar4[uVar14].witness_len,
                                  (uint8_t *)puVar9);
              bVar5 = uVar15 < uVar21;
              uVar14 = uVar15;
              uVar15 = (ulong)((int)uVar15 + 1);
            } while (bVar5);
          }
          uVar11 = (ulong)((int)uVar11 + 1);
          pwVar23 = local_90;
        } while (uVar11 < *psVar26);
      }
      if (pwVar23->num_outputs != 0) {
        uVar11 = 0;
        uVar14 = 1;
        do {
          pwVar1 = pwVar23->outputs;
          puVar20 = AbstractTransaction::CopyVariableBuffer
                              (pwVar1[uVar11].surjectionproof,pwVar1[uVar11].surjectionproof_len,
                               (uint8_t *)puVar9);
          puVar9 = (uint32_t *)
                   AbstractTransaction::CopyVariableBuffer
                             (pwVar1[uVar11].rangeproof,pwVar1[uVar11].rangeproof_len,puVar20);
          bVar5 = uVar14 < pwVar23->num_outputs;
          uVar11 = uVar14;
          uVar14 = (ulong)((int)uVar14 + 1);
        } while (bVar5);
      }
    }
    __return_storage_ptr__ = local_38;
    local_98 = (pointer)((long)puVar9 -
                        (long)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (local_98 <
        local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish +
        -(long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start) {
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
                 (size_type)local_98);
      local_80._0_8_ = "cfdcore_elements_transaction.cpp";
      local_80._8_4_ = 0xf63;
      local_80._16_8_ = "GetByteData";
      logger::log<unsigned_long&>
                ((CfdSourceLocation *)local_80,kCfdLogLevelInfo,"set buffer size[{}]",
                 (unsigned_long *)&local_98);
    }
  }
  ByteData::ByteData(__return_storage_ptr__,&local_60);
  if ((uint32_t *)
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint32_t *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransaction::GetByteData(bool has_witness) const {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  size_t size = 0;
  uint32_t flag = 0;
  if (has_witness) {
    flag = WALLY_TX_FLAG_USE_WITNESS;
  }

  int ret = wally_tx_get_length(tx_pointer, flag, &size);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_get_length NG[{}]. wit[{}]", ret,
        has_witness);
    throw CfdException(kCfdIllegalStateError, "tx length calc error.");
  }
  // info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
  if (size < kElementsTransactionMinimumSize) {
    ret = WALLY_EINVAL;
    warn(CFD_LOG_SOURCE, "tx size low.[{}]", size);
  }
  std::vector<uint8_t> buffer(size);
  if (ret != WALLY_EINVAL) {
    size_t txsize = size;
    // flag |= WALLY_TX_FLAG_USE_ELEMENTS;
    ret = wally_tx_to_bytes(
        tx_pointer, flag, buffer.data(), buffer.size(), &txsize);
  }
  if (ret == WALLY_EINVAL) {
    /* About conversion with object.
     * In libwally, txin / txout does not allow empty data.
     * Therefore, if txin / txout is empty, object to byte is an error.
     * Therefore, it performs its own processing under certain circumstances.
     */
    if ((tx_pointer->num_inputs == 0) || (tx_pointer->num_outputs == 0)) {
      info(CFD_LOG_SOURCE, "wally_tx_get_length size[{}]", size);
      bool has_txin_witness = false;
      bool has_txin_rangeproof = false;
      bool has_txout_witness = false;
      bool is_witness = false;
      // Necessary size calculation because wally_tx_get_length may be
      // an invalid value (reserved more)
      size_t need_size = sizeof(struct wally_tx);
      need_size += tx_pointer->num_inputs * sizeof(struct wally_tx_input);
      need_size += tx_pointer->num_outputs * sizeof(struct wally_tx_output);
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        need_size += sizeof(input->blinding_nonce);
        need_size += sizeof(input->entropy);
        if (input->issuance_amount) {
          need_size += input->issuance_amount_len + 10;
        }
        if (input->inflation_keys) {
          need_size += input->inflation_keys_len + 10;
        }
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->asset) need_size += output->asset_len + 10;
        if (output->value) need_size += output->value_len + 10;
        if (output->nonce) need_size += output->nonce_len + 10;
        if (output->script) need_size += output->script_len + 10;
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        // issuance amount range proof
        if (input->issuance_amount_rangeproof) {
          need_size += input->issuance_amount_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // inflation keys range proof
        if (input->inflation_keys_rangeproof) {
          need_size += input->inflation_keys_rangeproof_len + 10;
          has_txin_rangeproof = true;
        }
        // witness
        size_t num_items = input->witness ? input->witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        // pegin_witness
        num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
        for (uint32_t j = 0; j < num_items; ++j) {
          const struct wally_tx_witness_item *stack;
          stack = input->pegin_witness->items + j;
          need_size += stack->witness_len + 10;
          has_txin_witness = true;
        }
        need_size += 10;
      }
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        if (output->surjectionproof) {
          need_size += output->surjectionproof_len + 10;
          has_txout_witness = true;
        }
        if (output->rangeproof) {
          need_size += output->rangeproof_len + 10;
          has_txout_witness = true;
        }
        need_size += 10;
      }
      if (need_size > buffer.size()) {
        buffer.resize(need_size);
        info(CFD_LOG_SOURCE, "buffer.resize[{}]", need_size);
      }

      uint8_t *address_pointer = buffer.data();
      memcpy(
          address_pointer, &tx_pointer->version, sizeof(tx_pointer->version));
      address_pointer += sizeof(tx_pointer->version);
      uint8_t witness_flag = 0;
      if ((tx_pointer->version & kTransactionVersionNoWitness) == 0) {
        if (has_txin_witness || has_txin_rangeproof || has_txout_witness) {
          is_witness = true;
          witness_flag = 1;
        }
      }
      *address_pointer = witness_flag;
      ++address_pointer;

      // txin
      address_pointer =
          CopyVariableInt(tx_pointer->num_inputs, address_pointer);
      uint32_t temp_index;
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        const struct wally_tx_input *input = tx_pointer->inputs + i;
        temp_index = input->index;
        if (input->pegin_witness && (input->pegin_witness->num_items > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_PEGIN_FLAG);
        }
        if (input->issuance_amount && (input->issuance_amount_len > 0)) {
          temp_index |= static_cast<uint32_t>(WALLY_TX_ISSUANCE_FLAG);
        }
        memcpy(address_pointer, input->txhash, sizeof(input->txhash));
        address_pointer += sizeof(input->txhash);
        memcpy(address_pointer, &temp_index, sizeof(temp_index));
        address_pointer += sizeof(temp_index);
        address_pointer = CopyVariableBuffer(
            input->script, input->script_len, address_pointer);
        memcpy(address_pointer, &input->sequence, sizeof(input->sequence));
        address_pointer += sizeof(input->sequence);
        if (has_txin_rangeproof) {
          // blinding_nonce
          memcpy(
              address_pointer, &input->blinding_nonce,
              sizeof(input->blinding_nonce));
          address_pointer += sizeof(input->blinding_nonce);
          // entropy
          memcpy(address_pointer, &input->entropy, sizeof(input->entropy));
          address_pointer += sizeof(input->entropy);
          // issuance amount
          address_pointer = CopyConfidentialCommitment(
              input->issuance_amount, input->issuance_amount_len,
              kConfidentialValueSize, address_pointer);
          // inflation keys
          address_pointer = CopyConfidentialCommitment(
              input->inflation_keys, input->inflation_keys_len,
              kConfidentialValueSize, address_pointer);
        }
      }

      // txout
      address_pointer =
          CopyVariableInt(tx_pointer->num_outputs, address_pointer);
      for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
        const struct wally_tx_output *output = tx_pointer->outputs + i;
        // asset (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->asset, output->asset_len, kConfidentialDataSize,
            address_pointer);
        // value (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->value, output->value_len, kConfidentialValueSize,
            address_pointer);
        // nonce (fix size)
        address_pointer = CopyConfidentialCommitment(
            output->nonce, output->nonce_len, kConfidentialDataSize,
            address_pointer);
        // script
        address_pointer = CopyVariableBuffer(
            output->script, output->script_len, address_pointer);
      }

      // locktime
      memcpy(
          address_pointer, &tx_pointer->locktime,
          sizeof(tx_pointer->locktime));
      address_pointer += sizeof(tx_pointer->locktime);

      // witness
      if (is_witness) {
        for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
          const struct wally_tx_input *input = tx_pointer->inputs + i;
          // issuance amount range proof
          address_pointer = CopyVariableBuffer(
              input->issuance_amount_rangeproof,
              input->issuance_amount_rangeproof_len, address_pointer);
          // inflation keys range proof
          address_pointer = CopyVariableBuffer(
              input->inflation_keys_rangeproof,
              input->inflation_keys_rangeproof_len, address_pointer);
          // witness
          size_t num_items = input->witness ? input->witness->num_items : 0;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
          // pegin_witness
          num_items = 0;
          if (input->pegin_witness)
            num_items = input->pegin_witness->num_items;
          address_pointer = CopyVariableInt(num_items, address_pointer);
          for (uint32_t j = 0; j < num_items; ++j) {
            const struct wally_tx_witness_item *stack;
            stack = input->pegin_witness->items + j;
            address_pointer = CopyVariableBuffer(
                stack->witness, stack->witness_len, address_pointer);
          }
        }

        for (uint32_t i = 0; i < tx_pointer->num_outputs; ++i) {
          const struct wally_tx_output *output = tx_pointer->outputs + i;
          // surjection proof
          address_pointer = CopyVariableBuffer(
              output->surjectionproof, output->surjectionproof_len,
              address_pointer);
          // range proof
          address_pointer = CopyVariableBuffer(
              output->rangeproof, output->rangeproof_len, address_pointer);
        }
      }

      unsigned char *start_address = buffer.data();
      size = address_pointer - start_address;
      if (buffer.size() > size) {
        buffer.resize(size);
        info(CFD_LOG_SOURCE, "set buffer size[{}]", size);
      }
    } else {
      warn(
          CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}]. in/out={}/{}", ret,
          tx_pointer->num_inputs, tx_pointer->num_outputs);
      throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
    }
  } else if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_to_bytes NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "tx hex convert error.");
  }

  return ByteData(buffer);
}